

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

void linfcmp(lindef *lin,uchar *buf)

{
  ushort *puVar1;
  ushort uVar2;
  uchar *puVar3;
  mcmon *nump;
  
  if (((ulong)lin[2].linbuf & 0x3fffffe0000) == 0) {
    nump = (mcmon *)((long)&lin[1].linrenp + (ulong)((uint)((ulong)lin[2].linbuf >> 9) & 0xfe));
    if (*nump == 0xffff) {
      puVar3 = mcmalo0((mcmcxdef *)lin[1].linofsp,0x1000,nump,0xffff,0);
    }
    else {
      puVar3 = mcmlck((mcmcxdef *)lin[1].linofsp,*nump);
    }
    *(undefined4 *)(puVar3 + (ulong)(*(uint *)&lin[2].linbuf & 0x3ff) * 4) = *(undefined4 *)buf;
    lin[2].linbuf = lin[2].linbuf + 1;
    uVar2 = *(ushort *)
             (*(long *)(lin[1].linofsp + (ulong)(*nump >> 8) * 8 + 0x30) + (ulong)(*nump & 0xff) * 2
             );
    puVar1 = (ushort *)
             (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar2 >> 8) * 8) + 0x14 +
             (ulong)((uVar2 & 0xff) << 5));
    *puVar1 = *puVar1 | 1;
    mcmunlck((mcmcxdef *)lin[1].linofsp,*nump);
    return;
  }
  errsigf(*(errcxdef **)(*(long *)lin[1].linofsp + 8),"TADS",0x194);
}

Assistant:

void linfcmp(lindef *lin, uchar *buf)
{
    uint    pg;
    uchar  *objptr;
#   define  linf ((linfdef *)lin)

    /* figure out which page to use, and lock it */
    pg = linf->linfcrec >> 10;                     /* 2^10 records per page */
    if (pg >= LINFPGMAX)
        errsig(linf->linfmem->mcmcxgl->mcmcxerr, ERR_MANYDBG);
    if (linf->linfpg[pg] == MCMONINV)
        objptr = mcmalo(linf->linfmem, (ushort)(1024 * DBGLINFSIZ),
                        &linf->linfpg[pg]);
    else
        objptr = mcmlck(linf->linfmem, linf->linfpg[pg]);
    
    /* write the record to the appropriate offset within the page */
    memcpy(objptr + (linf->linfcrec & 1023) * DBGLINFSIZ, buf,
           (size_t)DBGLINFSIZ);
    
    /* increment counter of line records so far */
    ++(linf->linfcrec);
    
    /* done with page - touch it and unlock it */
    mcmtch(linf->linfmem, linf->linfpg[pg]);
    mcmunlck(linf->linfmem, linf->linfpg[pg]);
    
#   undef linf
}